

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Node::Node(Node *this,NodeType type,Instruction *instruction,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_00127a60;
  iVar2 = lastId + 1;
  this->id_ = lastId;
  lastId = iVar2;
  this->nodeType_ = type;
  this->llvmInstruction_ = instruction;
  this->callInstruction_ = callInst;
  p_Var1 = &(this->predecessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Node::Node(NodeType type, const Instruction *instruction,
           const CallInst *callInst)
        : id_(lastId++), nodeType_(type), llvmInstruction_(instruction),
          callInstruction_(callInst) {}